

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::XmlReporter::testRunEnded(XmlReporter *this,TestRunStats *testRunStats)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  undefined8 this_00;
  XmlWriter *this_01;
  long in_FS_OFFSET;
  undefined1 local_c8 [16];
  undefined1 local_b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  char local_88 [16];
  string local_78;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  StreamingReporterBase<Catch::XmlReporter>::testRunEnded
            (&this->super_StreamingReporterBase<Catch::XmlReporter>,testRunStats);
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"OverallResults","");
  this_01 = &this->m_xml;
  XmlWriter::scopedElement((XmlWriter *)local_c8,(string *)this_01,(XmlFormatting)local_58);
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"successes","");
  this_00 = local_c8._0_8_;
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_c8._0_8_,&local_78,&(testRunStats->totals).assertions.passed);
  local_98._M_allocated_capacity = (size_type)local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"failures","");
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)this_00,(string *)&local_98,&(testRunStats->totals).assertions.failed);
  pbVar2 = (pointer)(local_b8 + 0x10);
  local_b8._0_8_ = pbVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_c8 + 0x10),"expectedFailures","")
  ;
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)this_00,(string *)(local_c8 + 0x10),
             &(testRunStats->totals).assertions.failedButOk);
  if ((pointer)local_b8._0_8_ != pbVar2) {
    operator_delete((void *)local_b8._0_8_);
  }
  if ((char *)local_98._M_allocated_capacity != local_88) {
    operator_delete((void *)local_98._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_c8);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"OverallResultsCases","");
  XmlWriter::scopedElement((XmlWriter *)local_c8,(string *)this_01,(XmlFormatting)local_58);
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"successes","");
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_c8._0_8_,&local_78,&(testRunStats->totals).testCases.passed);
  local_98._M_allocated_capacity = (size_type)local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"failures","");
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_c8._0_8_,(string *)&local_98,
             &(testRunStats->totals).testCases.failed);
  local_b8._0_8_ = pbVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_c8 + 0x10),"expectedFailures","")
  ;
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_c8._0_8_,(string *)(local_c8 + 0x10),
             &(testRunStats->totals).testCases.failedButOk);
  if ((pointer)local_b8._0_8_ != pbVar2) {
    operator_delete((void *)local_b8._0_8_);
  }
  if ((char *)local_98._M_allocated_capacity != local_88) {
    operator_delete((void *)local_98._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_c8);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  XmlWriter::endElement(this_01,Newline|Indent);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlReporter::testRunEnded( TestRunStats const& testRunStats ) {
        StreamingReporterBase::testRunEnded( testRunStats );
        m_xml.scopedElement( "OverallResults" )
            .writeAttribute( "successes", testRunStats.totals.assertions.passed )
            .writeAttribute( "failures", testRunStats.totals.assertions.failed )
            .writeAttribute( "expectedFailures", testRunStats.totals.assertions.failedButOk );
        m_xml.scopedElement( "OverallResultsCases")
            .writeAttribute( "successes", testRunStats.totals.testCases.passed )
            .writeAttribute( "failures", testRunStats.totals.testCases.failed )
            .writeAttribute( "expectedFailures", testRunStats.totals.testCases.failedButOk );
        m_xml.endElement();
    }